

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_16bit(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ushort uVar8;
  uint8_t *__dest;
  ulong uVar9;
  int c;
  void *__src;
  uint uVar10;
  ulong uVar11;
  
  __src = decode->unpacked_buffer;
  uVar4._0_2_ = decode->channel_count;
  uVar4._2_2_ = decode->decode_flags;
  lVar6 = 0;
  uVar8 = (undefined2)uVar4;
  if ((short)(undefined2)uVar4 < 1) {
    uVar8 = 0;
  }
  for (; (ulong)uVar8 * 0x30 - lVar6 != 0; lVar6 = lVar6 + 0x30) {
    __src = (void *)((long)__src +
                    (long)(*(int *)((long)&decode->channels->width + lVar6) *
                           decode->user_line_begin_skip * 2));
  }
  uVar10 = (decode->chunk).height - (decode->user_line_end_ignore + decode->user_line_begin_skip);
  uVar9 = 0;
  uVar11 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = uVar9;
  }
  for (; uVar9 != uVar11; uVar9 = uVar9 + 1) {
    for (lVar6 = 0; lVar6 < (short)uVar4; lVar6 = lVar6 + 1) {
      peVar3 = decode->channels;
      iVar1 = peVar3[lVar6].width;
      iVar2 = peVar3[lVar6].user_pixel_stride;
      __dest = peVar3[lVar6].field_12.decode_to_ptr + (long)peVar3[lVar6].user_line_stride * uVar9;
      if ((long)iVar2 == 2) {
        memcpy(__dest,__src,(long)iVar1 * 2);
      }
      else {
        iVar5 = 0;
        if (0 < iVar1) {
          iVar5 = iVar1;
        }
        for (lVar7 = 0; iVar5 != (int)lVar7; lVar7 = lVar7 + 1) {
          *(undefined2 *)__dest = *(undefined2 *)((long)__src + lVar7 * 2);
          __dest = __dest + iVar2;
        }
      }
      __src = (void *)((long)__src + (long)iVar1 * 2);
      uVar4 = (uint)(ushort)decode->channel_count;
    }
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t* srcbuffer = decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, h, pixincrement;

    h = decode->chunk.height - decode->user_line_end_ignore;
    /*
     * if we have user_line_begin_skip, the user data pointer is at THAT
     * offset but our unpacked data is at y of '0' (well idx * height)
     */
    for (int c = 0; c < decode->channel_count; ++c)
    {
        exr_coding_channel_info_t* decc = (decode->channels + c);
        srcbuffer += decc->width * decode->user_line_begin_skip * 2;
    }
    h -= decode->user_line_begin_skip;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata        = decc->decode_to_ptr;
            w            = decc->width;
            pixincrement = decc->user_pixel_stride;
            cdata += (uint64_t) y * (uint64_t) decc->user_line_stride;
            /* specialize to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
            if (pixincrement == 2)
            {
                uint16_t*       tmp = (uint16_t*) cdata;
                const uint16_t* src = (const uint16_t*) srcbuffer;
                uint16_t*       end = tmp + w;

                while (tmp < end)
                    *tmp++ = one_to_native16 (*src++);
            }
            else
            {
                const uint16_t* src = (const uint16_t*) srcbuffer;
                for (int x = 0; x < w; ++x)
                {
                    *((uint16_t*) cdata) = one_to_native16 (*src++);
                    cdata += pixincrement;
                }
            }
#else
            if (pixincrement == 2)
            {
                memcpy (cdata, srcbuffer, (size_t) (w) * 2);
            }
            else
            {
                const uint16_t* src = (const uint16_t*) srcbuffer;
                for (int x = 0; x < w; ++x)
                {
                    *((uint16_t*) cdata) = *src++;
                    cdata += pixincrement;
                }
            }
#endif
            srcbuffer += w * 2;
        }
    }
    return EXR_ERR_SUCCESS;
}